

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

NativePixmapFactory *
eglu::selectNativePixmapFactory(NativeDisplayFactory *factory,CommandLine *cmdLine)

{
  NativePixmapFactoryRegistry *this;
  int iVar1;
  char *__s;
  NativePixmapFactory *pNVar2;
  AbstractFactory *pAVar3;
  undefined4 extraout_var;
  FactoryBase *this_00;
  char *pcVar4;
  NotSupportedError *pNVar5;
  size_t ndx;
  ulong index;
  allocator<char> local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this = &factory->m_nativePixmapRegistry;
  __s = tcu::CommandLine::getEGLPixmapType(cmdLine);
  if (__s == (char *)0x0) {
    if ((factory->m_nativePixmapRegistry).m_registry.m_factories.
        super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (factory->m_nativePixmapRegistry).m_registry.m_factories.
        super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar2 = tcu::FactoryRegistry<eglu::NativePixmapFactory>::getDefaultFactory(this);
      return pNVar2;
    }
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"No factory supporting EGL \'",(allocator<char> *)&local_70);
    std::operator+(&local_b0,&local_90,"pixmap");
    std::operator+(&local_d0,&local_b0,"\' type");
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,local_d0._M_dataplus._M_p,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x1ce);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,__s,(allocator<char> *)&local_b0);
  pNVar2 = (NativePixmapFactory *)
           tcu::GenericFactoryRegistry::getFactoryByName(&this->m_registry,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (pNVar2 != (NativePixmapFactory *)0x0) {
    return pNVar2;
  }
  tcu::print("ERROR: Unknown or unsupported EGL %s type \'%s\'","pixmap",__s);
  tcu::print("Available EGL %s types:\n","pixmap");
  for (index = 0;
      index < (ulong)((long)(factory->m_nativePixmapRegistry).m_registry.m_factories.
                            super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(factory->m_nativePixmapRegistry).m_registry.m_factories.
                            super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); index = index + 1) {
    pAVar3 = tcu::GenericFactoryRegistry::getFactoryByIndex(&this->m_registry,index);
    iVar1 = (*pAVar3->_vptr_AbstractFactory[2])(pAVar3);
    this_00 = (FactoryBase *)tcu::GenericFactoryRegistry::getFactoryByIndex(&this->m_registry,index)
    ;
    pcVar4 = tcu::FactoryBase::getDescription(this_00);
    tcu::print("  %s: %s\n",CONCAT44(extraout_var,iVar1),pcVar4);
  }
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Unsupported or unknown EGL ",&local_d1);
  std::operator+(&local_70,&local_50,"pixmap");
  std::operator+(&local_90,&local_70," type \'");
  std::operator+(&local_b0,&local_90,__s);
  std::operator+(&local_d0,&local_b0,"\'");
  tcu::NotSupportedError::NotSupportedError
            (pNVar5,local_d0._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x1c8);
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const NativePixmapFactory& selectNativePixmapFactory (const NativeDisplayFactory& factory, const tcu::CommandLine& cmdLine)
{
	return selectFactory(factory.getNativePixmapRegistry(), "pixmap", cmdLine.getEGLPixmapType());
}